

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateLoop<duckdb::interval_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  int64_t iVar6;
  undefined8 *__dest_00;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  anon_class_40_5_fa23cdf1 *count_00;
  ulong uVar10;
  size_t __n;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  idx_t iVar14;
  ulong uVar15;
  undefined8 *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  sel_t result_ids [2048];
  interval_t result_values [2048];
  idx_t local_a0b0;
  UpdateInfo *local_a0a8;
  void *local_a0a0;
  UpdateInfo *local_a098;
  long local_a090;
  UpdateInfo *local_a088;
  SelectionVector *local_a080;
  data_ptr_t local_a078;
  sel_t *local_a070;
  interval_t *local_a068;
  anon_class_40_5_fa23cdf1 local_a060;
  sel_t local_a038 [2048];
  interval_t local_8038 [2048];
  
  local_a078 = base_data->data;
  local_a080 = update->sel;
  local_a068 = (interval_t *)update->data;
  lVar9 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  __dest_00 = (undefined8 *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  local_a098 = update_info + 1;
  local_a0a0 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  local_a090 = (ulong)update_info->max * 4;
  local_a070 = sel->sel_vector;
  uVar2 = update_info->N;
  uVar18 = (ulong)base_info->N;
  uVar12 = 0;
  uVar17 = 0;
  uVar19 = 0;
  for (uVar10 = 0; uVar10 != count; uVar10 = uVar10 + 1) {
    uVar7 = uVar10;
    if (local_a070 != (sel_t *)0x0) {
      uVar7 = (ulong)local_a070[uVar10];
    }
    uVar7 = ids[uVar7] - lVar9;
    lVar20 = 0;
    for (lVar13 = 0; uVar17 + lVar13 < (ulong)uVar2; lVar13 = lVar13 + 1) {
      uVar3 = *(uint *)((long)&local_a098->segment + lVar13 * 4 + uVar17 * 4);
      if (uVar7 <= uVar3) {
        if (uVar7 == uVar3) {
          puVar16 = (undefined8 *)((long)local_a0a0 + lVar20 + uVar17 * 0x10);
          uVar5 = puVar16[1];
          puVar1 = (undefined8 *)((long)&local_8038[uVar12].months + lVar20);
          *puVar1 = *puVar16;
          puVar1[1] = uVar5;
          local_a038[uVar12 + lVar13] = uVar3;
          uVar17 = uVar17 + lVar13 + 1;
          uVar11 = uVar19;
          goto LAB_0053c8b1;
        }
        break;
      }
      puVar1 = (undefined8 *)((long)local_a0a0 + lVar20 + uVar17 * 0x10);
      uVar5 = puVar1[1];
      puVar16 = (undefined8 *)((long)&local_8038[uVar12].months + lVar20);
      *puVar16 = *puVar1;
      puVar16[1] = uVar5;
      local_a038[uVar12 + lVar13] = uVar3;
      lVar20 = lVar20 + 0x10;
    }
    uVar11 = uVar18;
    if (uVar18 < uVar19) {
      uVar11 = uVar19;
    }
    puVar16 = __dest_00 + uVar19 * 2;
    for (; uVar19 < uVar18; uVar19 = uVar19 + 1) {
      uVar15 = (ulong)*(uint *)((long)&__dest->segment + uVar19 * 4);
      if (uVar7 <= uVar15) {
        uVar11 = uVar19;
        if (uVar7 == uVar15) {
          uVar5 = puVar16[1];
          puVar1 = (undefined8 *)((long)&local_8038[uVar12].months + lVar20);
          *puVar1 = *puVar16;
          puVar1[1] = uVar5;
          goto LAB_0053c8a3;
        }
        break;
      }
      puVar16 = puVar16 + 2;
    }
    uVar5 = *(undefined8 *)(local_a078 + uVar7 * 0x10 + 8);
    puVar16 = (undefined8 *)((long)&local_8038[uVar12].months + lVar20);
    *puVar16 = *(undefined8 *)(local_a078 + uVar7 * 0x10);
    puVar16[1] = uVar5;
LAB_0053c8a3:
    local_a038[uVar12 + lVar13] = (sel_t)uVar7;
    uVar17 = uVar17 + lVar13;
LAB_0053c8b1:
    uVar12 = uVar12 + lVar13 + 1;
    uVar19 = uVar11;
  }
  sVar8 = uVar12 * 0x10;
  lVar13 = uVar17 * 4;
  lVar20 = uVar17 * 0x10;
  lVar21 = 0;
  uVar19 = uVar12 & 0xffffffff;
  for (; uVar17 < uVar2; uVar17 = uVar17 + 1) {
    puVar16 = (undefined8 *)((long)&update_info[1].segment + lVar21 * 4 + lVar20 + local_a090);
    iVar6 = puVar16[1];
    *(undefined8 *)(&local_8038[uVar12].months + lVar21) = *puVar16;
    *(int64_t *)(&local_8038[uVar12].months + lVar21 + 2) = iVar6;
    *(undefined4 *)((long)local_a038 + lVar21 + uVar12 * 4) =
         *(undefined4 *)((long)&update_info[1].segment + lVar21 + lVar13);
    lVar21 = lVar21 + 4;
    sVar8 = sVar8 + 0x10;
    uVar19 = (ulong)((sel_t)uVar19 + 1);
  }
  update_info->N = (sel_t)uVar19;
  local_a0a8 = base_info;
  local_a088 = update_info;
  switchD_00916250::default(local_a0a0,local_8038,sVar8);
  switchD_00916250::default(local_a098,&local_a038,lVar21 + uVar12 * 4);
  local_a060.result_offset = &local_a0b0;
  local_a0b0 = 0;
  count_00 = &local_a060;
  local_a060.update_vector_data = &local_a068;
  local_a060.update_vector_sel = local_a080;
  uVar2 = local_a0a8->N;
  uVar17 = 0;
  uVar19 = 0;
  puVar16 = __dest_00;
  local_a060.result_values = &local_8038;
  local_a060.result_ids = &local_a038;
  do {
    while( true ) {
      if ((count <= uVar19) || (uVar2 <= uVar17)) {
        for (; uVar19 < count; uVar19 = uVar19 + 1) {
          uVar10 = uVar19;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)sel->sel_vector[uVar19];
          }
          MergeUpdateLoopInternal<duckdb::interval_t,_duckdb::interval_t,_duckdb::ExtractStandardEntry>
          ::anon_class_40_5_fa23cdf1::operator()
                    (&local_a060,ids[uVar10] - lVar9,uVar10,(idx_t)count_00);
        }
        sVar8 = local_a0b0 * 4;
        __n = local_a0b0 << 4;
        iVar14 = local_a0b0;
        for (; uVar17 < uVar2; uVar17 = uVar17 + 1) {
          uVar4 = *(undefined4 *)((long)&__dest->segment + uVar17 * 4);
          uVar5 = puVar16[1];
          *(undefined8 *)(&local_8038[0].months + sVar8) = *puVar16;
          *(undefined8 *)((long)&local_8038[0].micros + sVar8 * 4) = uVar5;
          *(undefined4 *)((long)local_a038 + sVar8) = uVar4;
          sVar8 = sVar8 + 4;
          __n = __n + 0x10;
          iVar14 = (idx_t)((sel_t)iVar14 + 1);
          puVar16 = puVar16 + 2;
        }
        local_a0a8->N = (sel_t)iVar14;
        switchD_00916250::default(__dest_00,local_8038,__n);
        switchD_00916250::default(__dest,local_a038,sVar8);
        return;
      }
      uVar10 = uVar19;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)sel->sel_vector[uVar19];
      }
      iVar14 = ids[uVar10] - lVar9;
      uVar3 = *(uint *)((long)&__dest->segment + uVar17 * 4);
      if (iVar14 != uVar3) break;
      MergeUpdateLoopInternal<duckdb::interval_t,_duckdb::interval_t,_duckdb::ExtractStandardEntry>
      ::anon_class_40_5_fa23cdf1::operator()(&local_a060,iVar14,uVar10,(idx_t)count_00);
      uVar19 = uVar19 + 1;
LAB_0053ca39:
      uVar17 = uVar17 + 1;
      puVar16 = puVar16 + 2;
    }
    if (uVar3 <= iVar14) {
      count_00 = (anon_class_40_5_fa23cdf1 *)(uVar17 * 0x10);
      uVar5 = __dest_00[uVar17 * 2];
      iVar6 = (__dest_00 + uVar17 * 2)[1];
      local_8038[local_a0b0].months = (int)uVar5;
      local_8038[local_a0b0].days = (int)((ulong)uVar5 >> 0x20);
      local_8038[local_a0b0].micros = iVar6;
      local_a038[local_a0b0] = uVar3;
      local_a0b0 = local_a0b0 + 1;
      goto LAB_0053ca39;
    }
    MergeUpdateLoopInternal<duckdb::interval_t,_duckdb::interval_t,_duckdb::ExtractStandardEntry>::
    anon_class_40_5_fa23cdf1::operator()(&local_a060,iVar14,uVar10,(idx_t)count_00);
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}